

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FN_Up_Field(FORM *form)

{
  int iVar1;
  FIELD *newfield;
  FORM *form_local;
  
  newfield = Upper_Neighbour_Field(form->current);
  iVar1 = _nc_Set_Current_Field(form,newfield);
  return iVar1;
}

Assistant:

static int FN_Up_Field(FORM * form)
{
  return _nc_Set_Current_Field(form,
                               Upper_Neighbour_Field(form->current));
}